

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

string * complement(string *__return_storage_ptr__,string *sequence)

{
  size_type sVar1;
  size_type sVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  sVar1 = sequence->_M_string_length;
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string complement(string sequence)  {
    string complementString = "";
    for(char base : sequence) {
        if(base=='A'){
            complementString += 'T';
        }else if(base=='T'){
            complementString += 'A';
        }else if(base=='G'){
            complementString += 'C';
        }else if(base=='C'){
            complementString += 'G';
        }else {
            complementString += base;
        }
    }

    return complementString;
}